

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_interval.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformInterval(Transformer *this,PGIntervalConstant *node)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  PGAConst *args;
  undefined8 uVar4;
  type pFVar5;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  templated_unique_single_t result;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children_1;
  LogicalType target_type;
  LogicalType parse_type;
  string fname;
  int32_t QUARTER_MASK;
  int32_t MILLENNIUM_MASK;
  int32_t CENTURY_MASK;
  int32_t DECADE_MASK;
  int32_t WEEK_MASK;
  int32_t MICROSECOND_MASK;
  int32_t MILLISECOND_MASK;
  int32_t SECOND_MASK;
  int32_t MINUTE_MASK;
  int32_t HOUR_MASK;
  int32_t DAY_MASK;
  int32_t YEAR_MASK;
  int32_t MONTH_MASK;
  int32_t mask;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  string *in_stack_fffffffffffffa68;
  Value *in_stack_fffffffffffffa70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *this_00;
  undefined8 in_stack_fffffffffffffa78;
  int query_location;
  Transformer *in_stack_fffffffffffffa80;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_fffffffffffffa88;
  LogicalTypeId id;
  Value *in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffab8;
  allocator *paVar6;
  Value *in_stack_fffffffffffffac0;
  LogicalType *in_stack_fffffffffffffac8;
  Value *in_stack_fffffffffffffad8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb30;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_480;
  undefined1 local_458 [64];
  string local_418 [350];
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  allocator local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [38];
  undefined1 local_242;
  allocator local_241;
  string local_240 [38];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [38];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [38];
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [80];
  string local_178 [36];
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  PGAConst *local_120;
  uint local_118;
  undefined4 local_114;
  undefined1 local_102;
  allocator local_101;
  string local_100 [208];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_30 [3];
  long local_18;
  
  query_location = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  local_18 = in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)0x1a1567f);
  iVar1 = *(int *)(local_18 + 4);
  if (iVar1 == 0xd9) {
    Value::Value(in_stack_fffffffffffffa90,(int32_t)((ulong)in_stack_fffffffffffffa88.ptr >> 0x20));
    id = (LogicalTypeId)((ulong)in_stack_fffffffffffffa88.ptr >> 0x38);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>(in_stack_fffffffffffffad8);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffa70,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa70,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a15856);
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x1a15863);
    Value::~Value(in_stack_fffffffffffffa70);
  }
  else if (iVar1 == 0xdb) {
    Value::Value(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    id = (LogicalTypeId)((ulong)in_stack_fffffffffffffa88.ptr >> 0x38);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>(in_stack_fffffffffffffad8);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffa70,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa70,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a157a9);
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x1a157b6);
    Value::~Value(in_stack_fffffffffffffa70);
  }
  else {
    if (iVar1 != 0x161) {
      local_102 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_100,"Unsupported interval transformation",&local_101);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_102 = 0;
      __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
    }
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (local_30,*(PGNode **)(local_18 + 0x18));
    TransformExpression(in_stack_fffffffffffffa80,in_stack_fffffffffffffa88);
    id = (LogicalTypeId)((ulong)in_stack_fffffffffffffa88.ptr >> 0x38);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa70,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a15722);
  }
  if (*(long *)(local_18 + 0x20) == 0) {
    make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              (&in_stack_fffffffffffffac8->id_,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffac0);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::CastExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffa70,
               (unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>_> *)
               in_stack_fffffffffffffa68);
    unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                 *)0x1a159d8);
    local_114 = 1;
  }
  else {
    local_120 = (PGAConst *)PGPointerCast<duckdb_libpgquery::PGAConst>(in_stack_fffffffffffffa68);
    args = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator->
                     ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)in_stack_fffffffffffffa70);
    uVar3 = NumericCast<int,long,void>(0x1a15a42);
    local_124 = 2;
    local_128 = 4;
    local_12c = 8;
    local_130 = 0x400;
    local_134 = 0x800;
    local_138 = 0x1000;
    local_13c = 0x2000;
    local_140 = 0x4000;
    local_144 = 0x1000000;
    local_148 = 0x2000000;
    local_14c = 0x4000000;
    local_150 = 0x8000000;
    local_154 = 0x20000000;
    local_118 = uVar3;
    ::std::__cxx11::string::string(local_178);
    LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
    LogicalType::LogicalType((LogicalType *)0x1a15b16);
    if (((local_118 & 4) != 0) && ((local_118 & 2) != 0)) {
      local_1ca = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c8,"YEAR TO MONTH is not supported",&local_1c9);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_1ca = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 8) != 0) && ((local_118 & 0x400) != 0)) {
      local_1f2 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f0,"DAY TO HOUR is not supported",&local_1f1);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_1f2 = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 8) != 0) && ((local_118 & 0x800) != 0)) {
      local_21a = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      paVar6 = &local_219;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_218,"DAY TO MINUTE is not supported",paVar6);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_21a = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 8) != 0) && ((local_118 & 0x1000) != 0)) {
      local_242 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,"DAY TO SECOND is not supported",&local_241);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_242 = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 0x400) != 0) && ((local_118 & 0x800) != 0)) {
      local_26a = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_268,"HOUR TO MINUTE is not supported",&local_269);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_26a = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 0x400) != 0) && ((local_118 & 0x1000) != 0)) {
      local_292 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      paVar6 = &local_291;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_290,"HOUR TO SECOND is not supported",paVar6);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_292 = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if (((local_118 & 0x800) != 0) && ((local_118 & 0x1000) != 0)) {
      local_2ba = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      paVar6 = &local_2b9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"MINUTE TO SECOND is not supported",paVar6);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_2ba = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if ((local_118 & 4) == 0) {
      if ((local_118 & 2) == 0) {
        if ((local_118 & 8) == 0) {
          if ((local_118 & 0x400) == 0) {
            if ((local_118 & 0x800) == 0) {
              if ((local_118 & 0x1000) == 0) {
                if ((local_118 & 0x2000) == 0) {
                  if ((local_118 & 0x4000) == 0) {
                    if ((local_118 & 0x1000000) == 0) {
                      if ((local_118 & 0x20000000) == 0) {
                        if ((local_118 & 0x2000000) == 0) {
                          if ((local_118 & 0x4000000) == 0) {
                            if ((local_118 & 0x8000000) == 0) {
                              local_458[0x3e] = 1;
                              uVar4 = __cxa_allocate_exception(0x10);
                              paVar6 = (allocator *)(local_458 + 0x3f);
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        (local_418,"Unsupported interval post-fix",paVar6);
                              InternalException::InternalException
                                        ((InternalException *)in_stack_fffffffffffffa70,
                                         in_stack_fffffffffffffa68);
                              local_458[0x3e] = 0;
                              __cxa_throw(uVar4,&InternalException::typeinfo,
                                          InternalException::~InternalException);
                            }
                            ::std::__cxx11::string::operator=(local_178,"to_millennia");
                            LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                            LogicalType::operator=
                                      (&in_stack_fffffffffffffa70->type_,
                                       (LogicalType *)in_stack_fffffffffffffa68);
                            LogicalType::~LogicalType((LogicalType *)0x1a167c0);
                          }
                          else {
                            ::std::__cxx11::string::operator=(local_178,"to_centuries");
                            LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                            LogicalType::operator=
                                      (&in_stack_fffffffffffffa70->type_,
                                       (LogicalType *)in_stack_fffffffffffffa68);
                            LogicalType::~LogicalType((LogicalType *)0x1a1675e);
                          }
                        }
                        else {
                          ::std::__cxx11::string::operator=(local_178,"to_decades");
                          LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                          LogicalType::operator=
                                    (&in_stack_fffffffffffffa70->type_,
                                     (LogicalType *)in_stack_fffffffffffffa68);
                          LogicalType::~LogicalType((LogicalType *)0x1a166fc);
                        }
                      }
                      else {
                        ::std::__cxx11::string::operator=(local_178,"to_quarters");
                        LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                        LogicalType::operator=
                                  (&in_stack_fffffffffffffa70->type_,
                                   (LogicalType *)in_stack_fffffffffffffa68);
                        LogicalType::~LogicalType((LogicalType *)0x1a1669a);
                      }
                    }
                    else {
                      ::std::__cxx11::string::operator=(local_178,"to_weeks");
                      LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                      LogicalType::operator=
                                (&in_stack_fffffffffffffa70->type_,
                                 (LogicalType *)in_stack_fffffffffffffa68);
                      LogicalType::~LogicalType((LogicalType *)0x1a16638);
                    }
                  }
                  else {
                    ::std::__cxx11::string::operator=(local_178,"to_microseconds");
                    LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                    LogicalType::operator=
                              (&in_stack_fffffffffffffa70->type_,
                               (LogicalType *)in_stack_fffffffffffffa68);
                    LogicalType::~LogicalType((LogicalType *)0x1a165d6);
                  }
                }
                else {
                  ::std::__cxx11::string::operator=(local_178,"to_milliseconds");
                  LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                  LogicalType::operator=
                            (&in_stack_fffffffffffffa70->type_,
                             (LogicalType *)in_stack_fffffffffffffa68);
                  LogicalType::~LogicalType((LogicalType *)0x1a16574);
                }
              }
              else {
                ::std::__cxx11::string::operator=(local_178,"to_seconds");
                LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
                LogicalType::operator=
                          (&in_stack_fffffffffffffa70->type_,
                           (LogicalType *)in_stack_fffffffffffffa68);
                LogicalType::~LogicalType((LogicalType *)0x1a16512);
              }
            }
            else {
              ::std::__cxx11::string::operator=(local_178,"to_minutes");
              LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
              LogicalType::operator=
                        (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68)
              ;
              LogicalType::~LogicalType((LogicalType *)0x1a164b0);
            }
          }
          else {
            ::std::__cxx11::string::operator=(local_178,"to_hours");
            LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
            LogicalType::operator=
                      (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68);
            LogicalType::~LogicalType((LogicalType *)0x1a1644e);
          }
        }
        else {
          ::std::__cxx11::string::operator=(local_178,"to_days");
          LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
          LogicalType::operator=
                    (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68);
          LogicalType::~LogicalType((LogicalType *)0x1a163ec);
        }
      }
      else {
        ::std::__cxx11::string::operator=(local_178,"to_months");
        LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
        LogicalType::operator=
                  (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68);
        LogicalType::~LogicalType((LogicalType *)0x1a1638c);
      }
    }
    else {
      ::std::__cxx11::string::operator=(local_178,"to_years");
      LogicalType::LogicalType(&in_stack_fffffffffffffa90->type_,id);
      LogicalType::operator=
                (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68);
      LogicalType::~LogicalType((LogicalType *)0x1a16313);
    }
    make_uniq<duckdb::CastExpression,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              (in_stack_fffffffffffffac8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffac0);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::CastExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffa70,
               (unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>_> *)
               in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa70,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffa68);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a16921);
    unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                 *)0x1a1692b);
    bVar2 = LogicalType::operator!=
                      (&in_stack_fffffffffffffa70->type_,(LogicalType *)in_stack_fffffffffffffa68);
    if (bVar2) {
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)0x1a16965);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)in_stack_fffffffffffffa70,(value_type *)in_stack_fffffffffffffa68);
      make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((char (*) [6])args,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)CONCAT44(uVar3,in_stack_fffffffffffffb30));
      query_location = (int)((ulong)(local_458 + 8) >> 0x20);
      in_stack_fffffffffffffa80 = (Transformer *)local_458;
      unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
      unique_ptr<duckdb::FunctionExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffa70,
                 (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                  *)in_stack_fffffffffffffa68);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffa70,
                (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffa68);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0x1a169d7);
      unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                     *)0x1a169e1);
      make_uniq<duckdb::CastExpression,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                (in_stack_fffffffffffffac8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffac0);
      unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
      unique_ptr<duckdb::CastExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffa70,
                 (unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>_> *
                 )in_stack_fffffffffffffa68);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffa70,
                (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffa68);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0x1a16a34);
      unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                   *)0x1a16a41);
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 *)0x1a16a4e);
    }
    this_00 = &local_480;
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)0x1a16a88);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back(this_00,(value_type *)in_stack_fffffffffffffa68);
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
             ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                          *)this_00);
    SetQueryLocation((ParsedExpression *)in_stack_fffffffffffffa80,query_location);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::FunctionExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)this_00,
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                *)pFVar5);
    local_114 = 1;
    unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                 *)0x1a16b11);
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)0x1a16b1e);
    LogicalType::~LogicalType((LogicalType *)0x1a16b2b);
    LogicalType::~LogicalType((LogicalType *)0x1a16b38);
    ::std::__cxx11::string::~string(local_178);
  }
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0x1a16bc1);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformInterval(duckdb_libpgquery::PGIntervalConstant &node) {
	// handle post-fix notation of INTERVAL

	// three scenarios
	// interval (expr) year
	// interval 'string' year
	// interval int year
	unique_ptr<ParsedExpression> expr;
	switch (node.val_type) {
	case duckdb_libpgquery::T_PGAExpr:
		expr = TransformExpression(node.eval);
		break;
	case duckdb_libpgquery::T_PGString:
		expr = make_uniq<ConstantExpression>(Value(node.sval));
		break;
	case duckdb_libpgquery::T_PGInteger:
		expr = make_uniq<ConstantExpression>(Value(node.ival));
		break;
	default:
		throw InternalException("Unsupported interval transformation");
	}

	if (!node.typmods) {
		return make_uniq<CastExpression>(LogicalType::INTERVAL, std::move(expr));
	}

	int32_t mask = NumericCast<int32_t>(
	    PGPointerCast<duckdb_libpgquery::PGAConst>(node.typmods->head->data.ptr_value)->val.val.ival);
	// these seemingly random constants are from libpg_query/include/utils/datetime.hpp
	// they are copied here to avoid having to include this header
	// the bitshift is from the function INTERVAL_MASK in the parser
	constexpr int32_t MONTH_MASK = 1 << 1;
	constexpr int32_t YEAR_MASK = 1 << 2;
	constexpr int32_t DAY_MASK = 1 << 3;
	constexpr int32_t HOUR_MASK = 1 << 10;
	constexpr int32_t MINUTE_MASK = 1 << 11;
	constexpr int32_t SECOND_MASK = 1 << 12;
	constexpr int32_t MILLISECOND_MASK = 1 << 13;
	constexpr int32_t MICROSECOND_MASK = 1 << 14;
	constexpr int32_t WEEK_MASK = 1 << 24;
	constexpr int32_t DECADE_MASK = 1 << 25;
	constexpr int32_t CENTURY_MASK = 1 << 26;
	constexpr int32_t MILLENNIUM_MASK = 1 << 27;
	constexpr int32_t QUARTER_MASK = 1 << 29;

	// we need to check certain combinations
	// because certain interval masks (e.g. INTERVAL '10' HOURS TO DAYS) set multiple bits
	// for now we don't support all of the combined ones
	// (we might add support if someone complains about it)

	string fname;
	LogicalType parse_type = LogicalType::DOUBLE;
	LogicalType target_type;
	if (mask & YEAR_MASK && mask & MONTH_MASK) {
		// DAY TO HOUR
		throw ParserException("YEAR TO MONTH is not supported");
	} else if (mask & DAY_MASK && mask & HOUR_MASK) {
		// DAY TO HOUR
		throw ParserException("DAY TO HOUR is not supported");
	} else if (mask & DAY_MASK && mask & MINUTE_MASK) {
		// DAY TO MINUTE
		throw ParserException("DAY TO MINUTE is not supported");
	} else if (mask & DAY_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("DAY TO SECOND is not supported");
	} else if (mask & HOUR_MASK && mask & MINUTE_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO MINUTE is not supported");
	} else if (mask & HOUR_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO SECOND is not supported");
	} else if (mask & MINUTE_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("MINUTE TO SECOND is not supported");
	} else if (mask & YEAR_MASK) {
		// YEAR
		fname = "to_years";
		target_type = LogicalType::INTEGER;
	} else if (mask & MONTH_MASK) {
		// MONTH
		fname = "to_months";
		target_type = LogicalType::INTEGER;
	} else if (mask & DAY_MASK) {
		// DAY
		fname = "to_days";
		target_type = LogicalType::INTEGER;
	} else if (mask & HOUR_MASK) {
		// HOUR
		fname = "to_hours";
		target_type = LogicalType::BIGINT;
	} else if (mask & MINUTE_MASK) {
		// MINUTE
		fname = "to_minutes";
		target_type = LogicalType::BIGINT;
	} else if (mask & SECOND_MASK) {
		// SECOND
		fname = "to_seconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MILLISECOND_MASK) {
		// MILLISECOND
		fname = "to_milliseconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MICROSECOND_MASK) {
		// MICROSECOND
		fname = "to_microseconds";
		target_type = LogicalType::BIGINT;
	} else if (mask & WEEK_MASK) {
		// WEEK
		fname = "to_weeks";
		target_type = LogicalType::INTEGER;
	} else if (mask & QUARTER_MASK) {
		// QUARTER
		fname = "to_quarters";
		target_type = LogicalType::INTEGER;
	} else if (mask & DECADE_MASK) {
		// DECADE
		fname = "to_decades";
		target_type = LogicalType::INTEGER;
	} else if (mask & CENTURY_MASK) {
		// CENTURY
		fname = "to_centuries";
		target_type = LogicalType::INTEGER;
	} else if (mask & MILLENNIUM_MASK) {
		// MILLENNIUM
		fname = "to_millennia";
		target_type = LogicalType::INTEGER;
	} else {
		throw InternalException("Unsupported interval post-fix");
	}
	// first push a cast to the parse type
	expr = make_uniq<CastExpression>(parse_type, std::move(expr));

	// next, truncate it if the target type doesn't match the parse type
	if (target_type != parse_type) {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(expr));
		expr = make_uniq<FunctionExpression>("trunc", std::move(children));
		expr = make_uniq<CastExpression>(target_type, std::move(expr));
	}
	// now push the operation
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(std::move(expr));
	auto result = make_uniq<FunctionExpression>(fname, std::move(children));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}